

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Int_t *
Acb_DerivePatchSupportS
          (Cnf_Dat_t *pCnf,int nCiTars,int nCoDivs,Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF,
          Vec_Int_t *vSuppOld,int TimeOut)

{
  int iVar1;
  Vec_Int_t *__ptr;
  satoko_t *psVar2;
  satoko_opts_t *psVar3;
  abctime aVar4;
  abctime aVar5;
  ulong uVar6;
  abctime time;
  abctime time_00;
  int iVar7;
  int *piVar8;
  long lVar9;
  size_t __nmemb;
  int iVar10;
  uint uVar11;
  int Lit;
  timespec local_90;
  int local_7c;
  satoko_t *local_78;
  int *local_70;
  long local_68;
  int local_60;
  int local_5c;
  uint local_58;
  int local_54;
  ulong local_50;
  ulong local_48;
  Vec_Int_t *local_40;
  ulong local_38;
  
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 100;
  __ptr->nSize = 0;
  local_70 = (int *)malloc(400);
  __ptr->pArray = local_70;
  iVar10 = pCnf->nVars - nCiTars;
  psVar2 = satoko_create();
  local_48 = (ulong)(uint)nCoDivs;
  satoko_setnvars(psVar2,nCoDivs + nCiTars + pCnf->nVars * 2);
  psVar3 = satoko_options(psVar2);
  psVar3->no_simplify = '\x01';
  lVar9 = 0;
  while (lVar9 < pCnf->nClauses) {
    piVar8 = pCnf->pClauses[lVar9];
    iVar1 = satoko_add_clause(psVar2,piVar8,
                              (int)((ulong)((long)pCnf->pClauses[lVar9 + 1] - (long)piVar8) >> 2));
    lVar9 = lVar9 + 1;
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  local_7c = 2;
  iVar1 = satoko_add_clause(psVar2,&local_7c,1);
  if (iVar1 == 0) {
    return (Vec_Int_t *)0x0;
  }
  pCnf->pMan = (Aig_Man_t *)0x0;
  Cnf_DataLift(pCnf,pCnf->nVars);
  lVar9 = 0;
  while (lVar9 < pCnf->nClauses) {
    piVar8 = pCnf->pClauses[lVar9];
    iVar1 = satoko_add_clause(psVar2,piVar8,
                              (int)((ulong)((long)pCnf->pClauses[lVar9 + 1] - (long)piVar8) >> 2));
    lVar9 = lVar9 + 1;
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  Cnf_DataLift(pCnf,-pCnf->nVars);
  if (-2 < pCnf->nVars) {
    local_7c = pCnf->nVars * 2 + 2;
    iVar1 = satoko_add_clause(psVar2,&local_7c,1);
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
    if (nCiTars < 1) {
LAB_0039695c:
      local_78 = psVar2;
      if ((int)(uint)local_48 < 1) {
        __nmemb = 0;
        piVar8 = local_70;
      }
      else {
        iVar10 = clock_gettime(3,&local_90);
        if (iVar10 < 0) {
          local_68 = -1;
        }
        else {
          local_68 = CONCAT44(local_90.tv_nsec._4_4_,(int)local_90.tv_nsec) / 1000 +
                     CONCAT44(local_90.tv_sec._4_4_,(int)local_90.tv_sec) * 1000000;
        }
        iVar10 = pCnf->nVars;
        local_50 = (ulong)(uint)(nCiTars + iVar10 * 2);
        __ptr->nSize = 0;
        piVar8 = (int *)(ulong)(uint)(nCiTars * 2 + iVar10 * 4);
        uVar6 = 0;
        iVar10 = 4;
        local_70 = piVar8;
        local_40 = __ptr;
        do {
          psVar2 = local_78;
          local_58 = (int)local_50 + (int)uVar6;
          iVar1 = (int)uVar6 + pCnf->nVars;
          uVar11 = iVar1 + 2;
          local_38 = uVar6;
          if ((int)(uVar11 | local_58) < 0) {
            __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x538,"int satoko_add_xor(satoko_t *, int, int, int, int)");
          }
          iVar7 = (int)piVar8 + iVar10 + -3;
          local_90.tv_sec._4_4_ = iVar10 + 1;
          local_90.tv_nsec._0_4_ = iVar1 + 3 + uVar11;
          local_90.tv_sec._0_4_ = iVar7;
          local_5c = (int)local_90.tv_nsec;
          local_54 = local_90.tv_sec._4_4_;
          iVar1 = satoko_add_clause(local_78,(int *)&local_90,3);
          if (iVar1 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x53e,"int satoko_add_xor(satoko_t *, int, int, int, int)");
          }
          local_90.tv_sec._0_4_ = iVar7;
          local_90.tv_sec._4_4_ = iVar10;
          local_90.tv_nsec._0_4_ = uVar11 * 2;
          local_60 = iVar7;
          iVar1 = satoko_add_clause(psVar2,(int *)&local_90,3);
          if (iVar1 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x544,"int satoko_add_xor(satoko_t *, int, int, int, int)");
          }
          iVar7 = (int)local_70 + iVar10 + -4;
          local_90.tv_sec._4_4_ = local_54;
          local_90.tv_sec._0_4_ = iVar7;
          local_90.tv_nsec._0_4_ = uVar11 * 2;
          iVar1 = satoko_add_clause(psVar2,(int *)&local_90,3);
          if (iVar1 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x54a,"int satoko_add_xor(satoko_t *, int, int, int, int)");
          }
          local_90.tv_nsec._0_4_ = local_5c;
          local_90.tv_sec._0_4_ = iVar7;
          local_90.tv_sec._4_4_ = iVar10;
          iVar1 = satoko_add_clause(psVar2,(int *)&local_90,3);
          __ptr = local_40;
          piVar8 = local_70;
          if (iVar1 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x550,"int satoko_add_xor(satoko_t *, int, int, int, int)");
          }
          if ((int)local_58 < 0) goto LAB_00396cda;
          Vec_IntPush(local_40,local_60);
          psVar2 = local_78;
          uVar11 = (int)local_38 + 1;
          uVar6 = (ulong)uVar11;
          iVar10 = iVar10 + 2;
        } while ((uint)local_48 != uVar11);
        piVar8 = __ptr->pArray;
        iVar10 = __ptr->nSize;
        iVar1 = satoko_solve_assumptions(local_78,piVar8,iVar10);
        if (iVar1 != -1) {
          printf("Demonstrated that the problem has NO solution.  ");
          iVar1 = 3;
          iVar10 = clock_gettime(3,&local_90);
          if (iVar10 < 0) {
            lVar9 = -1;
          }
          else {
            lVar9 = CONCAT44(local_90.tv_nsec._4_4_,(int)local_90.tv_nsec) / 1000 +
                    CONCAT44(local_90.tv_sec._4_4_,(int)local_90.tv_sec) * 1000000;
          }
          lVar9 = lVar9 - local_68;
          Abc_Print(iVar1,"%s =","Time");
          Abc_Print(iVar1,"%9.2f sec\n",(double)lVar9 / 1000000.0);
          satoko_destroy(local_78);
          if (piVar8 != (int *)0x0) {
            free(piVar8);
          }
          free(__ptr);
          return (Vec_Int_t *)0x0;
        }
        printf("Proved that the problem has a solution.  ");
        aVar4 = Abc_Clock();
        Abc_PrintTime(0x9fa74a,(char *)(aVar4 - local_68),time);
        aVar4 = Abc_Clock();
        uVar11 = satoko_minimize_assumptions(psVar2,piVar8,iVar10,0);
        if (iVar10 < (int)uVar11) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        __ptr->nSize = uVar11;
        printf("Solved the problem with %d supp vars.  ",(ulong)uVar11);
        aVar5 = Abc_Clock();
        Abc_PrintTime(0x9fa74a,(char *)(aVar5 - aVar4),time_00);
        if (0 < (int)uVar11) {
          uVar6 = 0;
          do {
            if (piVar8[uVar6] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            piVar8[uVar6] = ((uint)piVar8[uVar6] >> 1) - (int)local_50;
            uVar6 = uVar6 + 1;
          } while (uVar11 != uVar6);
        }
        __nmemb = (size_t)(int)uVar11;
        qsort(piVar8,__nmemb,4,Vec_IntSortCompare1);
      }
      satoko_destroy(local_78);
      qsort(piVar8,__nmemb,4,Vec_IntSortCompare1);
      return __ptr;
    }
    if (-1 < iVar10) {
      local_7c = iVar10 * 2 + 1;
      iVar1 = satoko_add_clause(psVar2,&local_7c,1);
      if (iVar1 == 0) {
        return (Vec_Int_t *)0x0;
      }
      iVar10 = iVar10 + pCnf->nVars;
      if (-1 < iVar10) {
        local_7c = iVar10 * 2;
        iVar10 = satoko_add_clause(psVar2,&local_7c,1);
        if (iVar10 == 0) {
          return (Vec_Int_t *)0x0;
        }
        goto LAB_0039695c;
      }
    }
  }
LAB_00396cda:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

Vec_Int_t * Acb_DerivePatchSupportS( Cnf_Dat_t * pCnf, int nCiTars, int nCoDivs, Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF, Vec_Int_t * vSuppOld, int TimeOut )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, Lit;
    int iCoVarBeg = 1;
    int iCiVarBeg = pCnf->nVars - nCiTars;
    satoko_t * pSat = satoko_create();
    satoko_setnvars( pSat, 2 * pCnf->nVars + nCiTars + nCoDivs );
    satoko_options(pSat)->no_simplify = 1;
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !satoko_add_clause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !satoko_add_clause( pSat, &Lit, 1 ) )
        return NULL;
    // add clauses
    pCnf->pMan = NULL;
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !satoko_add_clause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            return NULL;
    Cnf_DataLift( pCnf, -pCnf->nVars );
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg+pCnf->nVars, 0 );
    if ( !satoko_add_clause( pSat, &Lit, 1 ) )
        return NULL;
    // create XORs for targets
    if ( nCiTars > 0 )
    {
/*
        int iXorVar = 2 * pCnf->nVars;
        int Lit;
        Vec_IntClear( vSupp );
        for ( i = 0; i < nCiTars; i++ )
        {
            satoko_add_xor( pSat, iXorVar+i, iCiVarBeg+i, iCiVarBeg+i+pCnf->nVars, 0 );
            Vec_IntPush( vSupp, Abc_Var2Lit(iXorVar+i, 0) );
        }
        if ( !satoko_add_clause( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) ) )
            return NULL;
*/
        // add negative literal
        Lit = Abc_Var2Lit( iCiVarBeg, 1 );
        if ( !satoko_add_clause( pSat, &Lit, 1 ) )
            return NULL;
        // add positive literal
        Lit = Abc_Var2Lit( iCiVarBeg+pCnf->nVars, 0 );
        if ( !satoko_add_clause( pSat, &Lit, 1 ) )
            return NULL;
    }
    // create XORs for divisors
    if ( nCoDivs > 0 )
    {
        abctime clk = Abc_Clock();
        int fUseMinAssump = 1;
        int iLit, status, nSuppNew;
        int iDivVar = 2 * pCnf->nVars + nCiTars;
        Vec_IntClear( vSupp );
        for ( i = 0; i < nCoDivs; i++ )
        {
            satoko_add_xor( pSat, iDivVar+i, iCoVarBeg+1+i, iCoVarBeg+1+i+pCnf->nVars, 0 );
            Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 1) );
/*                
            pLits[0] = Abc_Var2Lit(iCoVarBeg+1+i,             1);
            pLits[1] = Abc_Var2Lit(iCoVarBeg+1+i+pCnf->nVars, 0);
            pLits[2] = Abc_Var2Lit(iDivVar+i,                 1);
            if ( !satoko_add_clause( pSat, pLits, 3 ) )
                assert( 0 );

            pLits[0] = Abc_Var2Lit(iCoVarBeg+1+i,             0);
            pLits[1] = Abc_Var2Lit(iCoVarBeg+1+i+pCnf->nVars, 1);
            pLits[2] = Abc_Var2Lit(iDivVar+i,                 1);
            if ( !satoko_add_clause( pSat, pLits, 3 ) )
                assert( 0 );

            Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 0) );
*/
        }

        // try one run
        status = satoko_solve_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) );
        if ( status != l_False )
        {
            printf( "Demonstrated that the problem has NO solution.  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            satoko_destroy( pSat );
            Vec_IntFree( vSupp );
            return NULL;
        }
        assert( status == l_False );
        printf( "Proved that the problem has a solution.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

        // find minimum subset
        if ( fUseMinAssump )
        {
            abctime clk = Abc_Clock();
            nSuppNew = satoko_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            printf( "Solved the problem with %d supp vars.  ", Vec_IntSize(vSupp) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        else
        {
            int * pFinal, nFinal = satoko_final_conflict( pSat, &pFinal );
            printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
            Vec_IntClear( vSupp ); 
            for ( i = 0; i < nFinal; i++ )
                Vec_IntPush( vSupp, Abc_LitNot(pFinal[i]) );
            // try one run
            status = satoko_solve_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) );
            assert( status == l_False );
            // try again
            nFinal = satoko_final_conflict( pSat, &pFinal );
            printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
        }

        // remap them into numbers
        Vec_IntForEachEntry( vSupp, iLit, i )
            Vec_IntWriteEntry( vSupp, i, Abc_Lit2Var(iLit)-iDivVar );
        Vec_IntSort( vSupp, 0 );
        //Vec_IntPrint( vSupp );
    }
    satoko_destroy( pSat );
    Vec_IntSort( vSupp, 0 );
    return vSupp;
}